

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitBrOn
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,BrOn *curr)

{
  Expression **childp;
  HeapType local_38;
  Type local_30;
  HeapType local_28;
  BasicHeapType local_1c;
  BrOn *pBStack_18;
  BasicHeapType top;
  BrOn *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  
  pBStack_18 = curr;
  curr_local = (BrOn *)this;
  if (curr->op < BrOnCast) {
    noteAnyReference(this,&curr->ref);
  }
  else {
    if (1 < curr->op - BrOnCast) {
      handle_unreachable("unexpected op",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                         ,0x369);
    }
    local_28 = wasm::Type::getHeapType(&curr->castType);
    local_1c = HeapType::getTop(&local_28);
    childp = &pBStack_18->ref;
    HeapType::HeapType(&local_38,local_1c);
    wasm::Type::Type(&local_30,local_38,Nullable,Inexact);
    note(this,childp,local_30);
  }
  return;
}

Assistant:

void visitBrOn(BrOn* curr) {
    switch (curr->op) {
      case BrOnNull:
      case BrOnNonNull:
        noteAnyReference(&curr->ref);
        return;
      case BrOnCast:
      case BrOnCastFail: {
        auto top = curr->castType.getHeapType().getTop();
        note(&curr->ref, Type(top, Nullable));
        return;
      }
    }
    WASM_UNREACHABLE("unexpected op");
  }